

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
SerialSimulationDataGenerator::CreateSerialByte(SerialSimulationDataGenerator *this,U64 value)

{
  U32 UVar1;
  Parity PVar2;
  SerialAnalyzerSettings *pSVar3;
  uint uVar4;
  int iVar5;
  BitState BVar6;
  ulong uVar7;
  bool bVar8;
  BitExtractor bit_extractor;
  BitExtractor aBStack_38 [8];
  
  BVar6 = (int)this + 0x40;
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(BVar6);
  pSVar3 = this->mSettings;
  uVar7 = value ^ -(ulong)pSVar3->mInverted;
  bVar8 = pSVar3->mSerialMode != Normal;
  UVar1 = pSVar3->mBitsPerTransfer;
  BitExtractor::BitExtractor(aBStack_38,uVar7,pSVar3->mShiftOrder,bVar8 + UVar1);
  for (iVar5 = bVar8 + UVar1; iVar5 != 0; iVar5 = iVar5 + -1) {
    BitExtractor::GetNextBit();
    SimulationChannelDescriptor::TransitionIfNeeded(BVar6);
    ClockGenerator::AdvanceByHalfPeriod(1.0);
    SimulationChannelDescriptor::Advance(BVar6);
  }
  PVar2 = this->mSettings->mParity;
  if (PVar2 == Even) {
    uVar4 = AnalyzerHelpers::GetOnesCount(uVar7);
    AnalyzerHelpers::IsEven((ulong)uVar4);
  }
  else {
    if (PVar2 != Odd) goto LAB_001083ad;
    uVar4 = AnalyzerHelpers::GetOnesCount(uVar7);
    AnalyzerHelpers::IsOdd((ulong)uVar4);
  }
  SimulationChannelDescriptor::TransitionIfNeeded(BVar6);
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptor::Advance(BVar6);
LAB_001083ad:
  SimulationChannelDescriptor::TransitionIfNeeded(BVar6);
  ClockGenerator::AdvanceByHalfPeriod(this->mSettings->mStopBits);
  SimulationChannelDescriptor::Advance(BVar6);
  BitExtractor::~BitExtractor(aBStack_38);
  return;
}

Assistant:

void SerialSimulationDataGenerator::CreateSerialByte( U64 value )
{
    // assume we start high

    mSerialSimulationData.Transition();                                     // low-going edge for start bit
    mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() ); // add start bit time

    if( mSettings->mInverted == true )
        value = ~value;

    U32 num_bits = mSettings->mBitsPerTransfer;
    if( mSettings->mSerialMode != SerialAnalyzerEnums::Normal )
        num_bits++;

    BitExtractor bit_extractor( value, mSettings->mShiftOrder, num_bits );

    for( U32 i = 0; i < num_bits; i++ )
    {
        mSerialSimulationData.TransitionIfNeeded( bit_extractor.GetNextBit() );
        mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    if( mSettings->mParity == AnalyzerEnums::Even )
    {
        if( AnalyzerHelpers::IsEven( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mSerialSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mSerialSimulationData.TransitionIfNeeded( mBitHigh ); // we want to add a one bit

        mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }
    else if( mSettings->mParity == AnalyzerEnums::Odd )
    {
        if( AnalyzerHelpers::IsOdd( AnalyzerHelpers::GetOnesCount( value ) ) == true )
            mSerialSimulationData.TransitionIfNeeded( mBitLow ); // we want to add a zero bit
        else
            mSerialSimulationData.TransitionIfNeeded( mBitHigh );

        mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod() );
    }

    mSerialSimulationData.TransitionIfNeeded( mBitHigh ); // we need to end high

    // let's pad the end a bit for the stop bit:
    mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( mSettings->mStopBits ) );
}